

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O0

void gz_compress(FILE *in,gzFile out)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  gzFile file;
  size_t sVar4;
  gzFile in_RSI;
  FILE *in_RDI;
  int len;
  char *buf;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  file = (gzFile)calloc(0x4000,1);
  if (file == (gzFile)0x0) {
    perror("out of memory");
    exit(1);
  }
  while( true ) {
    sVar4 = fread(file,1,0x4000,in_RDI);
    iVar1 = (int)sVar4;
    iVar2 = ferror(in_RDI);
    if (iVar2 != 0) {
      free(file);
      perror("fread");
      exit(1);
    }
    if (iVar1 == 0) break;
    iVar3 = zng_gzwrite(file,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    if (iVar3 != iVar1) {
      gz_fatal(in_RSI);
    }
  }
  free(file);
  fclose(in_RDI);
  iVar3 = zng_gzclose(file);
  if (iVar3 != 0) {
    error((char *)0x102b1b);
  }
  return;
}

Assistant:

static void gz_compress(FILE *in, gzFile out) {
    char *buf;
    int len;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    buf = (char *)calloc(BUFLEN, 1);
    if (buf == NULL) {
        perror("out of memory");
        exit(1);
    }

    for (;;) {
        len = (int)fread(buf, 1, BUFLEN, in);
        if (ferror(in)) {
            free(buf);
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (PREFIX(gzwrite)(out, buf, (unsigned)len) != len) gz_fatal(out);
    }
    free(buf);
    fclose(in);
    if (PREFIX(gzclose)(out) != Z_OK) error("failed gzclose");
}